

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::computeSimplexLpDualInfeasible(HEkk *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  long in_RDI;
  double dual_infeasibility_1;
  double upper_1;
  double lower_1;
  double dual_1;
  HighsInt iVar_1;
  HighsInt iRow;
  double dual_infeasibility;
  double upper;
  double lower;
  double dual;
  HighsInt iVar;
  HighsInt iCol;
  double *sum_dual_infeasibility;
  double *max_dual_infeasibility;
  HighsInt *num_dual_infeasibility;
  double scaled_dual_feasibility_tolerance;
  double local_78;
  double local_70;
  value_type local_68;
  value_type local_60;
  int local_58;
  int local_54;
  double local_50;
  double local_48;
  value_type local_40;
  value_type local_38;
  int local_30;
  int local_2c;
  double *local_28;
  double *local_20;
  int *local_18;
  double local_10;
  
  local_10 = *(double *)(*(long *)(in_RDI + 8) + 0x120);
  local_18 = (int *)(in_RDI + 0x1d0);
  local_20 = (double *)(in_RDI + 0x1d8);
  local_28 = (double *)(in_RDI + 0x1e0);
  *local_18 = 0;
  *local_20 = 0.0;
  *local_28 = 0.0;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x2198); local_2c = local_2c + 1) {
    local_30 = local_2c;
    pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                        (long)local_2c);
    if (*pvVar2 != '\0') {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2578),
                          (long)local_30);
      local_38 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21b8),
                          (long)local_2c);
      local_40 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21d0),
                          (long)local_2c);
      local_48 = *pvVar3;
      local_50 = 0.0;
      bVar1 = highs_isInfinity(local_48);
      if (bVar1) {
        bVar1 = highs_isInfinity(-local_40);
        if (bVar1) {
          local_50 = ABS(local_38);
        }
        else {
          local_50 = -local_38;
        }
      }
      else {
        bVar1 = highs_isInfinity(-local_40);
        if (bVar1) {
          local_50 = local_38;
        }
        else {
          local_50 = 0.0;
        }
      }
      if (0.0 < local_50) {
        if (local_10 <= local_50) {
          *local_18 = *local_18 + 1;
        }
        pdVar4 = std::max<double>(&local_50,local_20);
        *local_20 = *pdVar4;
        *local_28 = local_50 + *local_28;
      }
    }
  }
  for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x219c); local_54 = local_54 + 1) {
    local_58 = *(int *)(in_RDI + 0x2198) + local_54;
    pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                        (long)local_58);
    if (*pvVar2 != '\0') {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2578),
                          (long)local_58);
      local_60 = -*pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21e8),
                          (long)local_54);
      local_68 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2200),
                          (long)local_54);
      local_70 = *pvVar3;
      local_78 = 0.0;
      bVar1 = highs_isInfinity(local_70);
      if (bVar1) {
        bVar1 = highs_isInfinity(-local_68);
        if (bVar1) {
          local_78 = ABS(local_60);
        }
        else {
          local_78 = -local_60;
        }
      }
      else {
        bVar1 = highs_isInfinity(-local_68);
        if (bVar1) {
          local_78 = local_60;
        }
        else {
          local_78 = 0.0;
        }
      }
      if (0.0 < local_78) {
        if (local_10 <= local_78) {
          *local_18 = *local_18 + 1;
        }
        pdVar4 = std::max<double>(&local_78,local_20);
        *local_20 = *pdVar4;
        *local_28 = local_78 + *local_28;
      }
    }
  }
  return;
}

Assistant:

void HEkk::computeSimplexLpDualInfeasible() {
  // Compute num/max/sum of dual infeasibilities according to the
  // bounds of the simplex LP. Assumes that boxed variables have
  // primal variable at the bound corresponding to the sign of the
  // dual so should only be used in dual phase 1 - where it's only
  // used for reporting after rebuilds.
  const double scaled_dual_feasibility_tolerance =
      options_->dual_feasibility_tolerance;
  HighsInt& num_dual_infeasibility =
      analysis_.num_dual_phase_1_lp_dual_infeasibility;
  double& max_dual_infeasibility =
      analysis_.max_dual_phase_1_lp_dual_infeasibility;
  double& sum_dual_infeasibility =
      analysis_.sum_dual_phase_1_lp_dual_infeasibility;
  num_dual_infeasibility = 0;
  max_dual_infeasibility = 0;
  sum_dual_infeasibility = 0;

  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    HighsInt iVar = iCol;
    if (!basis_.nonbasicFlag_[iVar]) continue;
    // Nonbasic column
    const double dual = info_.workDual_[iVar];
    const double lower = lp_.col_lower_[iCol];
    const double upper = lp_.col_upper_[iCol];
    double dual_infeasibility = 0;
    if (highs_isInfinity(upper)) {
      if (highs_isInfinity(-lower)) {
        // Free: any nonzero dual value is infeasible
        dual_infeasibility = fabs(dual);
      } else {
        // Only lower bounded: a negative dual is infeasible
        dual_infeasibility = -dual;
      }
    } else {
      if (highs_isInfinity(-lower)) {
        // Only upper bounded: a positive dual is infeasible
        dual_infeasibility = dual;
      } else {
        // Boxed or fixed: any dual value is feasible
        dual_infeasibility = 0;
      }
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= scaled_dual_feasibility_tolerance)
        num_dual_infeasibility++;
      max_dual_infeasibility =
          std::max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibility += dual_infeasibility;
    }
  }
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = lp_.num_col_ + iRow;
    if (!basis_.nonbasicFlag_[iVar]) continue;
    // Nonbasic row
    const double dual = -info_.workDual_[iVar];
    const double lower = lp_.row_lower_[iRow];
    const double upper = lp_.row_upper_[iRow];
    double dual_infeasibility = 0;
    if (highs_isInfinity(upper)) {
      if (highs_isInfinity(-lower)) {
        // Free: any nonzero dual value is infeasible
        dual_infeasibility = fabs(dual);
      } else {
        // Only lower bounded: a negative dual is infeasible
        dual_infeasibility = -dual;
      }
    } else {
      if (highs_isInfinity(-lower)) {
        // Only upper bounded: a positive dual is infeasible
        dual_infeasibility = dual;
      } else {
        // Boxed or fixed: any dual value is feasible
        dual_infeasibility = 0;
      }
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= scaled_dual_feasibility_tolerance)
        num_dual_infeasibility++;
      max_dual_infeasibility =
          std::max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibility += dual_infeasibility;
    }
  }
}